

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Util.cpp
# Opt level: O2

size_t replaceAll(string *str,char *oldValue,string *newValue)

{
  string *psVar1;
  ulong uVar2;
  size_t sVar3;
  
  psVar1 = (string *)strlen(oldValue);
  sVar3 = 0;
  while( true ) {
    uVar2 = std::__cxx11::string::find((char *)str,(ulong)oldValue);
    if (uVar2 == 0xffffffffffffffff) break;
    std::__cxx11::string::replace((ulong)str,uVar2,psVar1);
    sVar3 = sVar3 + 1;
  }
  return sVar3;
}

Assistant:

size_t replaceAll(std::string& str, const char* oldValue,const std::string& newValue)
{
	size_t pos = 0;
	size_t len = strlen(oldValue);

	size_t count = 0;
	while ((pos = str.find(oldValue, pos)) != std::string::npos)
	{
		str.replace(pos,len,newValue);
		pos += newValue.length();
		count++;
	}

	return count;
}